

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

void __thiscall gvr::PLYReader::readData(PLYReader *this)

{
  char cVar1;
  pointer ppPVar2;
  ulong uVar3;
  
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    ppPVar2 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppPVar2) {
      uVar3 = 0;
      do {
        PLYElement::readData(ppPVar2[uVar3],(streambuf *)&this->field_0x30);
        uVar3 = uVar3 + 1;
        ppPVar2 = (this->list).
                  super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar3 < (ulong)((long)(this->list).
                                     super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar2 >> 3
                              ));
    }
    std::ifstream::close();
    return;
  }
  return;
}

Assistant:

void PLYReader::readData()
{
  if (in.is_open())
  {
    std::streambuf *sb=in.rdbuf();

    for (size_t i=0; i<list.size(); i++)
    {
      list[i]->readData(sb);
    }

    in.close();
  }
}